

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

bool __thiscall
QItemSelectionRangeRefCache::contains
          (QItemSelectionRangeRefCache *this,int row,int column,QModelIndex *parentIndex)

{
  char cVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = this->m_top;
  if (iVar2 < -1) {
    iVar2 = QPersistentModelIndex::row(&this->m_range->tl);
    this->m_top = iVar2;
    iVar2 = QPersistentModelIndex::column(&this->m_range->tl);
    this->m_left = iVar2;
    iVar2 = QPersistentModelIndex::row(&this->m_range->br);
    this->m_bottom = iVar2;
    iVar3 = QPersistentModelIndex::column(&this->m_range->br);
    this->m_right = iVar3;
    iVar2 = this->m_top;
  }
  else {
    iVar3 = this->m_right;
  }
  bVar4 = false;
  if ((((row <= this->m_bottom) && (bVar4 = false, column <= iVar3)) &&
      (bVar4 = false, iVar2 <= row)) && (this->m_left <= column)) {
    cVar1 = (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
            super__Optional_payload_base<QModelIndex>._M_engaged;
    if ((bool)cVar1 == false) {
      QPersistentModelIndex::parent(&local_48,&this->m_range->tl);
      cVar1 = (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
              super__Optional_payload_base<QModelIndex>._M_engaged;
      (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
      super__Optional_payload_base<QModelIndex>._M_payload._M_value.m.ptr = local_48.m.ptr;
      *(undefined8 *)
       &(this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_payload = local_48._0_8_;
      (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
      super__Optional_payload_base<QModelIndex>._M_payload._M_value.i = local_48.i;
      if ((bool)cVar1 == false) {
        (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_engaged = true;
        cVar1 = '\x01';
      }
    }
    if (cVar1 == '\0') {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        contains();
      }
      goto LAB_0046202d;
    }
    if ((((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
          super__Optional_payload_base<QModelIndex>._M_payload._M_value.r == parentIndex->r) &&
        ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
         super__Optional_payload_base<QModelIndex>._M_payload._M_value.c == parentIndex->c)) &&
       ((this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
        super__Optional_payload_base<QModelIndex>._M_payload._M_value.i == parentIndex->i)) {
      bVar4 = (this->m_parent).super__Optional_base<QModelIndex,_true,_true>._M_payload.
              super__Optional_payload_base<QModelIndex>._M_payload._M_value.m.ptr ==
              (parentIndex->m).ptr;
    }
    else {
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
LAB_0046202d:
  __stack_chk_fail();
}

Assistant:

inline bool contains(int row, int column, const QModelIndex &parentIndex)
    {
        populate();
        return (m_bottom >= row && m_right >= column &&
                m_top    <= row && m_left  <= column &&
                parent() == parentIndex);
    }